

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer.h
# Opt level: O2

void __thiscall RingBuffer<QuickPacket>::RingBuffer(RingBuffer<QuickPacket> *this,uint16_t capacity)

{
  ulong *puVar1;
  undefined6 in_register_00000032;
  QuickPacket *this_00;
  long lVar2;
  ulong uVar3;
  
  this->_capacity = (int)CONCAT62(in_register_00000032,capacity);
  this->_read_index = 0;
  this->_write_index = 0;
  this->_buffer = (QuickPacket *)0x0;
  if ((ushort)(capacity - 3) < 0xfffc) {
    uVar3 = (ulong)capacity;
    puVar1 = (ulong *)operator_new__(uVar3 * 0x28 + 8);
    *puVar1 = uVar3;
    lVar2 = 0;
    this_00 = (QuickPacket *)(puVar1 + 1);
    do {
      QuickPacket::QuickPacket(this_00);
      lVar2 = lVar2 + -0x28;
      this_00 = this_00 + 1;
    } while (uVar3 * -0x28 - lVar2 != 0);
    this->_buffer = (QuickPacket *)(puVar1 + 1);
    LOCK();
    (this->_packet_count).super___atomic_base<unsigned_short>._M_i = 0;
    UNLOCK();
    return;
  }
  __assert_fail("capacity > 2 && capacity < MAX_PACKET_COUNT",
                "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/quick/ring_buffer.h"
                ,0xb,"RingBuffer<QuickPacket>::RingBuffer(uint16_t) [T = QuickPacket]");
}

Assistant:

explicit RingBuffer(uint16_t capacity) :
	_capacity(capacity){
		assert(capacity > 2 && capacity < MAX_PACKET_COUNT);
		_buffer = new T[_capacity];
		_packet_count = 0;
	}